

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::RaceSuccessfulPromiseNode<void>::RaceSuccessfulPromiseNode
          (RaceSuccessfulPromiseNode<void> *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> promises,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  long *in_RSI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *ptrCopy;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_40;
  
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0037fa60;
  pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)*in_RSI;
  sVar2 = in_RSI[1];
  pAVar3 = (ArrayDisposer *)in_RSI[2];
  *in_RSI = 0;
  in_RSI[1] = 0;
  local_40.ptr = pOVar1;
  local_40.size_ = sVar2;
  local_40.disposer = pAVar3;
  RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
            (&this->super_RaceSuccessfulPromiseNodeBase,&local_40,
             &(this->output).super_ExceptionOrValue,(SourceLocation)promises);
  if (pOVar1 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pOVar1,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
  }
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0037fa60;
  (this->output).super_ExceptionOrValue.exception.ptr.isSet = false;
  (this->output).value.ptr.isSet = false;
  return;
}

Assistant:

RaceSuccessfulPromiseNode<void>::RaceSuccessfulPromiseNode(
    Array<OwnPromiseNode> promises, SourceLocation location)
    : RaceSuccessfulPromiseNodeBase(kj::mv(promises), output, location) {}